

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int IoTHubTransport_MQTT_Common_Subscribe(TRANSPORT_LL_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  char *device_id;
  STRING_HANDLE pSVar2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  PMQTTTRANSPORT_HANDLE_DATA transport_data;
  int result;
  TRANSPORT_LL_HANDLE handle_local;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Subscribe",0xdd0,1,"Invalid handle parameter. NULL.");
    }
    transport_data._4_4_ = 0xdd1;
  }
  else if (*(long *)((long)handle + 0x48) == 0) {
    device_id = STRING_c_str(*(STRING_HANDLE *)((long)handle + 0x40));
    pSVar2 = buildTopicMqttMsg(device_id);
    *(STRING_HANDLE *)((long)handle + 8) = pSVar2;
    if (*(long *)((long)handle + 8) == 0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"IoTHubTransport_MQTT_Common_Subscribe",0xdde,1,
                  "Failure constructing Message Topic");
      }
      transport_data._4_4_ = 0xddf;
    }
    else {
      *(uint *)((long)handle + 0x30) = *(uint *)((long)handle + 0x30) | 4;
      changeStateToSubscribeIfAllowed((PMQTTTRANSPORT_HANDLE_DATA)handle);
      transport_data._4_4_ = 0;
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_Subscribe",0xdd6,1,
                "Cannot specify modules for C2D style messages, per IoT Hub protocol limitations.");
    }
    transport_data._4_4_ = 0xdd7;
  }
  return transport_data._4_4_;
}

Assistant:

int IoTHubTransport_MQTT_Common_Subscribe(TRANSPORT_LL_HANDLE handle)
{
    int result;
    PMQTTTRANSPORT_HANDLE_DATA transport_data = (PMQTTTRANSPORT_HANDLE_DATA)handle;
    if (transport_data == NULL)
    {
        LogError("Invalid handle parameter. NULL.");
        result = MU_FAILURE;
    }
    else if (transport_data->module_id != NULL)
    {
        // This very strongly points to an internal error.  This code path should never be reachable from the IoTHub module client API.
        LogError("Cannot specify modules for C2D style messages, per IoT Hub protocol limitations.");
        result = MU_FAILURE;
    }
    else
    {
        transport_data->topic_MqttMessage = buildTopicMqttMsg(STRING_c_str(transport_data->device_id));
        if (transport_data->topic_MqttMessage == NULL)
        {
            LogError("Failure constructing Message Topic");
            result = MU_FAILURE;
        }
        else
        {
            transport_data->topics_ToSubscribe |= SUBSCRIBE_TELEMETRY_TOPIC;
            changeStateToSubscribeIfAllowed(transport_data);
            result = 0;
        }
    }
    return result;
}